

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.h
# Opt level: O0

bool __thiscall
flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
          (VerifierTemplate<false> *this,uint8_t *vec,size_t elem_size,size_t *end)

{
  bool bVar1;
  uint uVar2;
  size_t elem;
  size_t elem_len;
  unsigned_long byte_size;
  size_t max_elems;
  uint size;
  size_t vec_offset;
  size_t *end_local;
  size_t elem_size_local;
  uint8_t *vec_local;
  VerifierTemplate<false> *this_local;
  
  elem = (long)vec - (long)this->buf_;
  bVar1 = Verify<unsigned_int>(this,elem);
  if (bVar1) {
    uVar2 = ReadScalar<unsigned_int>(vec);
    bVar1 = Check(this,(ulong)uVar2 < (this->opts_).max_size / elem_size);
    if (bVar1) {
      elem_len = elem_size * uVar2 + 4;
      if (end != (size_t *)0x0) {
        *end = elem + elem_len;
      }
      this_local._7_1_ = Verify(this,elem,elem_len);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool VerifyVectorOrString(const uint8_t *const vec, const size_t elem_size,
                            size_t *const end = nullptr) const {
    const auto vec_offset = static_cast<size_t>(vec - buf_);
    // Check we can read the size field.
    if (!Verify<LenT>(vec_offset)) return false;
    // Check the whole array. If this is a string, the byte past the array must
    // be 0.
    const LenT size = ReadScalar<LenT>(vec);
    const auto max_elems = opts_.max_size / elem_size;
    if (!Check(size < max_elems))
      return false;  // Protect against byte_size overflowing.
    const auto byte_size = sizeof(LenT) + elem_size * size;
    if (end) *end = vec_offset + byte_size;
    return Verify(vec_offset, byte_size);
  }